

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O3

void __thiscall
fizplex::SimplexTest_RangeRowFixedVarOptimalSolution_Test::
SimplexTest_RangeRowFixedVarOptimalSolution_Test
          (SimplexTest_RangeRowFixedVarOptimalSolution_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_SimplexTest).super_Test._vptr_Test = (_func_int **)&PTR__SimplexTest_001c1c60;
  LP::LP(&(this->super_SimplexTest).lp);
  DVector::DVector(&(this->super_SimplexTest).x,0);
  (this->super_SimplexTest).super_Test._vptr_Test = (_func_int **)&PTR__SimplexTest_001c19f8;
  return;
}

Assistant:

TEST_F(SimplexTest, RangeRowFixedVarOptimalSolution) {
  lp.add_column(ColType::Fixed, 0, 0, -1);
  lp.add_row(RowType::Range, -5, 5, {1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(0.0, z);
  EXPECT_DOUBLE_EQ(0.0, x[0]);
}